

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O0

void vu_dialog(t_vu *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *canvas;
  int iVar1;
  t_symbol *s_00;
  t_float tVar2;
  t_float tVar3;
  t_float tVar4;
  undefined1 local_178 [8];
  t_atom undo [18];
  int sr_flags;
  int scale;
  int h;
  int w;
  t_symbol *srl [3];
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_vu *x_local;
  
  tVar2 = atom_getfloatarg(0,argc,argv);
  tVar3 = atom_getfloatarg(1,argc,argv);
  tVar4 = atom_getfloatarg(4,argc,argv);
  undo[0x11].a_w._4_4_ = (undefined4)tVar4;
  iemgui_setdialogatoms(&x->x_gui,0x12,(t_atom *)local_178);
  undo[1].a_w.w_float = 1.4013e-45;
  undo[2].a_type = 0x3c23d70a;
  undo[2].a_w.w_float = 1.4013e-45;
  undo[3].a_type = 0x3f800000;
  undo[3].a_w.w_float = 1.4013e-45;
  undo[4].a_type = (t_atomtype)(float)x->x_scale;
  undo[4].a_w.w_float = 1.4013e-45;
  undo[5].a_type = 0xbf800000;
  undo[0xe].a_w.w_float = 2.8026e-45;
  undo[0xf]._0_8_ = gensym("none");
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,(t_atom *)local_178,argc,argv);
  undo[0x11].a_w._0_4_ = iemgui_dialog(&x->x_gui,(t_symbol **)&h,argc,argv);
  (x->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)(x->x_gui).x_fsf & 0xffffff7f);
  (x->x_gui).x_isa = (t_iem_init_symargs)((uint)(x->x_gui).x_isa & 0xfffffffe);
  iVar1 = iemgui_clip_size((int)tVar2);
  (x->x_gui).x_w = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
  vu_check_height(x,(int)tVar3);
  if (undo[0x11].a_w._4_4_ != 0) {
    undo[0x11].a_w._4_4_ = 1;
  }
  vu_scale(x,(float)(int)undo[0x11].a_w._4_4_);
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void vu_dialog(t_vu *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int w = (int)atom_getfloatarg(0, argc, argv);
    int h = (int)atom_getfloatarg(1, argc, argv);
    int scale = (int)atom_getfloatarg(4, argc, argv);
    int sr_flags;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT(undo+2, 0.01);
    SETFLOAT(undo+3, 1);
    SETFLOAT(undo+4, x->x_scale);
    SETFLOAT(undo+5, -1);
    SETSYMBOL(undo+15, gensym("none"));
    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    x->x_gui.x_fsf.x_snd_able = 0;
    x->x_gui.x_isa.x_loadinit = 0;
    x->x_gui.x_w = iemgui_clip_size(w) * IEMGUI_ZOOM(x);
    vu_check_height(x, h);
    if(scale != 0)
        scale = 1;
    vu_scale(x, (t_float)scale);
    iemgui_size(x, &x->x_gui);
}